

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::testAngularLimitMotor
          (btGeneric6DofSpring2Constraint *this,int axis_index)

{
  int in_ESI;
  long in_RDI;
  btScalar test_value;
  btScalar unaff_retaddr;
  btScalar angle;
  long lVar1;
  
  lVar1 = in_RDI;
  btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x56c));
  test_value = btAdjustAngleToLimits(unaff_retaddr,(btScalar)((ulong)lVar1 >> 0x20),(btScalar)lVar1)
  ;
  *(btScalar *)(in_RDI + (long)in_ESI * 0x58 + 0x430) = test_value;
  btRotationalLimitMotor2::testLimitValue
            ((btRotationalLimitMotor2 *)(in_RDI + 0x3e0 + (long)in_ESI * 0x58),test_value);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::testAngularLimitMotor(int axis_index)
{
	btScalar angle = m_calculatedAxisAngleDiff[axis_index];
	angle = btAdjustAngleToLimits(angle, m_angularLimits[axis_index].m_loLimit, m_angularLimits[axis_index].m_hiLimit);
	m_angularLimits[axis_index].m_currentPosition = angle;
	m_angularLimits[axis_index].testLimitValue(angle);
}